

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O0

_Bool ptrlen_endswith(ptrlen whole,ptrlen suffix,ptrlen *tail)

{
  int iVar1;
  ulong __n;
  ulong uVar2;
  ptrlen *tail_local;
  ptrlen suffix_local;
  ptrlen whole_local;
  
  uVar2 = whole.len;
  __n = suffix.len;
  if ((__n <= uVar2) &&
     (iVar1 = memcmp((void *)((long)whole.ptr + (uVar2 - __n)),suffix.ptr,__n), iVar1 == 0)) {
    if (tail != (ptrlen *)0x0) {
      tail->ptr = whole.ptr;
      tail->len = uVar2 - __n;
    }
    return true;
  }
  return false;
}

Assistant:

bool ptrlen_endswith(ptrlen whole, ptrlen suffix, ptrlen *tail)
{
    if (whole.len >= suffix.len &&
        !memcmp((char *)whole.ptr + (whole.len - suffix.len),
                suffix.ptr, suffix.len)) {
        if (tail) {
            tail->ptr = whole.ptr;
            tail->len = whole.len - suffix.len;
        }
        return true;
    }
    return false;
}